

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibrary.cpp
# Opt level: O3

FunctionSignature * __thiscall
Jinx::Impl::Library::FindFunctionSignature
          (FunctionSignature *__return_storage_ptr__,Library *this,FunctionSignature *signature)

{
  int iVar1;
  __normal_iterator<const_Jinx::Impl::FunctionSignature_*,_std::vector<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>_>
  copy;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_functionMutex);
  if (iVar1 == 0) {
    copy = std::
           __find_if<__gnu_cxx::__normal_iterator<Jinx::Impl::FunctionSignature_const*,std::vector<Jinx::Impl::FunctionSignature,Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,4096ul,16ul>>>,__gnu_cxx::__ops::_Iter_equals_val<Jinx::Impl::FunctionSignature_const>>
                     ((this->m_functionList).
                      super__Vector_base<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (this->m_functionList).
                      super__Vector_base<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>
                      ._M_impl.super__Vector_impl_data._M_finish,signature);
    if (copy._M_current ==
        (this->m_functionList).
        super__Vector_base<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      (__return_storage_ptr__->m_staticArena).m_ptr = (char *)__return_storage_ptr__;
      __return_storage_ptr__->m_id = 0;
      __return_storage_ptr__->m_visibility = Local;
      (__return_storage_ptr__->m_libraryName)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_libraryName).field_2;
      (__return_storage_ptr__->m_libraryName)._M_string_length = 0;
      (__return_storage_ptr__->m_libraryName).field_2._M_local_buf[0] = '\0';
      (__return_storage_ptr__->m_parts).
      super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
      ._M_impl.super__Tp_alloc_type.m_arena = &__return_storage_ptr__->m_staticArena;
      (__return_storage_ptr__->m_parts).
      super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->m_parts).
      super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->m_parts).
      super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      FunctionSignature::FunctionSignature(__return_storage_ptr__,copy._M_current);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_functionMutex);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

inline_t FunctionSignature Library::FindFunctionSignature(const FunctionSignature & signature) const
	{
		std::lock_guard<std::mutex> lock(m_functionMutex);
		auto itr = std::find(m_functionList.begin(), m_functionList.end(), signature);
		if (itr == m_functionList.end())
			return FunctionSignature();
		return *itr;
	}